

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  Format FVar4;
  LineOrder *pLVar5;
  TileDescription *pTVar6;
  Box2i *pBVar7;
  undefined8 uVar8;
  Header *header_00;
  Compressor *pCVar9;
  TileBuffer *pTVar10;
  value_type pTVar11;
  reference ppTVar12;
  char *__s;
  long in_RDI;
  Compressor *compressor_00;
  TileOffsets *numXTiles;
  char *p;
  size_t i;
  Compressor *compressor;
  stringstream _iex_throw_s;
  Box2i *dataWindow;
  stringstream *in_stack_fffffffffffffda8;
  ArgExc *in_stack_fffffffffffffdb0;
  Compressor *in_stack_fffffffffffffdc0;
  int **in_stack_fffffffffffffdd0;
  Header *in_stack_fffffffffffffdd8;
  int chunks;
  Compressor *in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffe00;
  int *in_stack_fffffffffffffe08;
  TileBuffer *this_00;
  TileBuffer *__n;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  LevelMode in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  Compression in_stack_fffffffffffffe24;
  size_t in_stack_fffffffffffffe28;
  Compression in_stack_fffffffffffffe34;
  undefined8 local_1bc;
  undefined8 local_1b4;
  stringstream local_1a0 [16];
  ostream local_190 [200];
  string *in_stack_ffffffffffffff38;
  Header *in_stack_ffffffffffffff40;
  
  Header::operator=((Header *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Header::setType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pLVar5 = Header::lineOrder((Header *)0x1b8988);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0xc0) = *pLVar5;
  pTVar6 = Header::tileDescription((Header *)0x1b89a5);
  lVar1 = *(long *)(in_RDI + 8);
  *(undefined8 *)(lVar1 + 0x40) = *(undefined8 *)pTVar6;
  *(undefined8 *)(lVar1 + 0x48) = *(undefined8 *)&pTVar6->mode;
  pBVar7 = Header::dataWindow((Header *)0x1b89c9);
  *(int *)(*(long *)(in_RDI + 8) + 0xc4) = (pBVar7->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 200) = (pBVar7->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xcc) = (pBVar7->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0xd0) = (pBVar7->max).y;
  *(ulong *)(*(long *)(in_RDI + 8) + 0x1b8) =
       (ulong)(uint)(*(int *)(*(long *)(in_RDI + 8) + 0x44) * *(int *)(*(long *)(in_RDI + 8) + 0x40)
                    ) << 2;
  uVar2 = *(ulong *)(*(long *)(in_RDI + 8) + 0x1b8);
  uVar3 = std::numeric_limits<unsigned_int>::max();
  if (uVar2 <= uVar3) {
    numXTiles = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xe8);
    compressor_00 = (Compressor *)(*(long *)(in_RDI + 8) + 0xd4);
    header_00 = (Header *)(*(long *)(in_RDI + 8) + 0xd8);
    precalculateTileInfo
              ((TileDescription *)in_stack_fffffffffffffdc0,(int)((ulong)header_00 >> 0x20),
               (int)header_00,(int)((ulong)compressor_00 >> 0x20),(int)compressor_00,
               (int **)numXTiles,in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdd8,
               (int *)in_stack_fffffffffffffde0);
    if (*(int *)(*(long *)(in_RDI + 8) + 0xc0) == 0) {
      anon_unknown_7::TileCoord::TileCoord((TileCoord *)&local_1bc,0,0,0,0);
    }
    else {
      anon_unknown_7::TileCoord::TileCoord
                ((TileCoord *)&local_1bc,0,**(int **)(*(long *)(in_RDI + 8) + 0xe8) + -1,0,0);
    }
    lVar1 = *(long *)(in_RDI + 8);
    *(undefined8 *)(lVar1 + 0x188) = local_1bc;
    *(undefined8 *)(lVar1 + 400) = local_1b4;
    Header::compression((Header *)0x1b8c22);
    pCVar9 = newTileCompressor(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               (Header *)
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    FVar4 = defaultFormat(compressor_00);
    *(Format *)(*(long *)(in_RDI + 8) + 0x118) = FVar4;
    if ((pCVar9 != (Compressor *)0x0) &&
       (in_stack_fffffffffffffde0 = pCVar9, pCVar9 != (Compressor *)0x0)) {
      (*pCVar9->_vptr_Compressor[1])();
      in_stack_fffffffffffffde0 = pCVar9;
    }
    TileOffsets::TileOffsets
              ((TileOffsets *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    TileOffsets::operator=((TileOffsets *)compressor_00,numXTiles);
    TileOffsets::~TileOffsets((TileOffsets *)0x1b8cf7);
    chunks = (int)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
    getChunkOffsetTableSize(header_00);
    Header::setChunkCount((Header *)in_stack_fffffffffffffde0,chunks);
    this_00 = (TileBuffer *)0x0;
    while (__n = this_00,
          pTVar10 = (TileBuffer *)
                    std::
                    vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                    ::size((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x138)), this_00 < pTVar10) {
      pTVar11 = (value_type)operator_new(0xb8);
      anon_unknown_7::TileBuffer::TileBuffer(this_00);
      ppTVar12 = std::
                 vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                 ::operator[]((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                               *)(*(long *)(in_RDI + 8) + 0x138),(size_type)__n);
      *ppTVar12 = pTVar11;
      std::
      vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
      ::operator[]((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x138),(size_type)__n);
      Array<char>::resizeErase((Array<char> *)in_stack_fffffffffffffdc0,(long)header_00);
      ppTVar12 = std::
                 vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                 ::operator[]((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                               *)(*(long *)(in_RDI + 8) + 0x138),(size_type)__n);
      __s = Array::operator_cast_to_char_((Array *)&((*ppTVar12)->tileCoord).lx);
      memset(__s,0,*(size_t *)(*(long *)(in_RDI + 8) + 0x1b8));
      Header::compression((Header *)0x1b8e25);
      in_stack_fffffffffffffdc0 =
           newCompressor(in_stack_fffffffffffffe24,
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (Header *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      ppTVar12 = std::
                 vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                 ::operator[]((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                               *)(*(long *)(in_RDI + 8) + 0x138),(size_type)__n);
      ((*ppTVar12)->exception).field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdc0;
      this_00 = (TileBuffer *)((long)&(__n->buffer)._size + 1);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Deep tile size exceeds maximum permitted area");
  uVar8 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  __cxa_throw(uVar8,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header& header)
{
    _data->header = header;
    _data->header.setType (DEEPTILE);
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->maxSampleCountTableSize =
        _data->tileDesc.ySize * _data->tileDesc.xSize * sizeof (int);

    //
    // impose limit of 2^32 bytes of storage for maxSampleCountTableSize
    // (disallow files with very large tile areas that would otherwise cause excessive memory allocation)
    //

    if (_data->maxSampleCountTableSize >
        std::numeric_limits<unsigned int>::max ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Deep tile size exceeds maximum permitted area");
    }

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor (
        _data->header.compression (), 0, _data->tileDesc.ySize, _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0) delete compressor;

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);

    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount (getChunkOffsetTableSize (_data->header));

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        char* p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}